

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O0

VRGraphicsToolkit * __thiscall
MinVR::VRItemFactory::createItem<MinVR::VRGraphicsToolkit>
          (VRItemFactory *this,VRMainInterface *vrMain,VRDataIndex *config,string *dataContainer)

{
  bool bVar1;
  type_info *in_RCX;
  type_info *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  VRSpecificItemFactory<MinVR::VRGraphicsToolkit> *factory;
  VRGraphicsToolkit *local_8;
  
  (**(code **)(*in_RDI + 0x10))();
  bVar1 = std::type_info::operator==(in_RDX,in_RCX);
  if ((bVar1) && (in_RDI != (long *)0x0)) {
    local_8 = (VRGraphicsToolkit *)(**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  else {
    local_8 = (VRGraphicsToolkit *)0x0;
  }
  return local_8;
}

Assistant:

T* createItem(VRMainInterface *vrMain, VRDataIndex *config, const std::string &dataContainer) {

    if (getType() == typeid(T)) {

      VRSpecificItemFactory<T>* factory = static_cast<VRSpecificItemFactory<T>*>(this);
			if(factory) {

				return factory->create(vrMain, config, dataContainer);
			}
		}

		return NULL;
	}